

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string_test.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::(anonymous_namespace)::MicroStringPrevTest_SetStringMedium_Test::
~MicroStringPrevTest_SetStringMedium_Test(MicroStringPrevTest_SetStringMedium_Test *this)

{
  internal::anon_unknown_0::MicroStringPrevTest_SetStringMedium_Test::
  ~MicroStringPrevTest_SetStringMedium_Test
            ((MicroStringPrevTest_SetStringMedium_Test *)(this + -0x10));
  return;
}

Assistant:

TEST_P(MicroStringPrevTest, SetStringMedium) {
  std::string input(16, 'a');
  const size_t used = arena_space_used();
  const size_t self_used = str_.SpaceUsedExcludingSelfLong();
  str_.Set(std::move(input), arena());
  // NOLINTNEXTLINE: We really didn't move from the input, so this is fine.
  EXPECT_EQ(str_.Get(), input);

  const bool will_reuse = !(prev_state() == kInline || prev_state() == kAlias ||
                            prev_state() == kUnowned);

  if (will_reuse) {
    ExpectMemoryUsed(used, false, self_used);
  } else {
    ExpectMemoryUsed(used, true, kMicroRepSize + input.size());
  }
}